

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

int Fx_ManDivRemoveLits(Vec_Int_t *vCube,Vec_Int_t *vDiv,int fCompl)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  
  iVar6 = vDiv->nSize;
  if (fCompl == 0) {
    if (iVar6 < 1) {
      return 0;
    }
  }
  else {
    bVar11 = iVar6 != 4;
    iVar6 = 4;
    if (bVar11) {
      __assert_fail("!fCompl || Vec_IntSize(vDiv) == 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                    ,0x29e,"int Fx_ManDivRemoveLits(Vec_Int_t *, Vec_Int_t *, int)");
    }
  }
  piVar1 = vDiv->pArray;
  uVar5 = 0;
  iVar4 = 0;
  do {
    if (piVar1[uVar5] < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    uVar9 = (uint)piVar1[uVar5] >> 1;
    iVar7 = vCube->nSize;
    uVar8 = (ulong)iVar7;
    iVar3 = 0;
    if (1 < (long)uVar8) {
      piVar2 = vCube->pArray;
      uVar10 = 2;
LAB_002cdbd0:
      if (piVar2[uVar10 - 1] != ((fCompl != 0 && 1 < uVar5) ^ uVar9)) break;
      if ((int)uVar10 < iVar7) {
        do {
          piVar2[uVar10 - 1] = piVar2[uVar10];
          uVar10 = uVar10 + 1;
          iVar7 = vCube->nSize;
        } while ((int)uVar10 < iVar7);
      }
      uVar8 = (ulong)(iVar7 - 1U);
      vCube->nSize = iVar7 - 1U;
      iVar6 = vDiv->nSize;
      iVar3 = 1;
    }
LAB_002cdc13:
    iVar7 = (int)uVar8;
    iVar4 = iVar3 + iVar4;
    if (iVar6 == 2) {
      iVar3 = 0;
      if (1 < iVar7) {
        piVar2 = vCube->pArray;
        uVar10 = 2;
LAB_002cdc39:
        if ((piVar2[uVar10 - 1] ^ uVar9) != 1) goto code_r0x002cdc47;
        if ((int)uVar10 < iVar7) {
          do {
            piVar2[uVar10 - 1] = piVar2[uVar10];
            uVar10 = uVar10 + 1;
            iVar7 = vCube->nSize;
          } while ((int)uVar10 < iVar7);
        }
        vCube->nSize = iVar7 + -1;
        iVar6 = vDiv->nSize;
        iVar3 = 1;
      }
LAB_002cdc83:
      iVar4 = iVar4 + iVar3;
    }
    uVar5 = uVar5 + 1;
    if ((long)iVar6 <= (long)uVar5) {
      return iVar4;
    }
  } while( true );
  bVar11 = uVar10 == uVar8;
  uVar10 = uVar10 + 1;
  if (bVar11) goto LAB_002cdc13;
  goto LAB_002cdbd0;
code_r0x002cdc47:
  bVar11 = uVar10 == (uVar8 & 0xffffffff);
  uVar10 = uVar10 + 1;
  if (bVar11) goto LAB_002cdc83;
  goto LAB_002cdc39;
}

Assistant:

static inline int Fx_ManDivRemoveLits( Vec_Int_t * vCube, Vec_Int_t * vDiv, int fCompl )
{
    int i, Lit, Count = 0;
    assert( !fCompl || Vec_IntSize(vDiv) == 4 );
    Vec_IntForEachEntry( vDiv, Lit, i )
    {
        Count += Vec_IntRemove1( vCube, Abc_Lit2Var(Lit) ^ (fCompl && i > 1) );  // the last two lits can be complemented
        if ( Vec_IntSize( vDiv ) == 2 )
            Count += Vec_IntRemove1( vCube, Abc_LitNot( Abc_Lit2Var(Lit) ) );
    }
    return Count;
}